

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_left_basics.cpp
# Opt level: O1

void test_1d_static<30ul>(void)

{
  uint *t;
  int *piVar1;
  int dptr [30];
  uint local_bc;
  int *local_b8;
  int *local_b0;
  unsigned_long local_a8 [15];
  
  local_a8[0]._0_1_ = true;
  local_b8._0_1_ = 1;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x1d,"void test_1d_static() [X = 30UL]",(bool *)local_a8,(bool *)&local_b8);
  piVar1 = (int *)0x0;
  local_a8[0] = (ulong)local_a8[0]._1_7_ << 8;
  local_b8 = (int *)((ulong)local_b8._1_7_ << 8);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_dynamic_stride(0))","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x1f,"void test_1d_static() [X = 30UL]",(bool *)local_a8,(bool *)&local_b8);
  local_a8[0] = 1;
  local_b8 = (int *)CONCAT44(local_b8._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x21,"void test_1d_static() [X = 30UL]",local_a8,(int *)&local_b8);
  local_a8[0] = 0x1e;
  local_b8 = (int *)0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x23,"void test_1d_static() [X = 30UL]",local_a8,(unsigned_long *)&local_b8);
  local_a8[0] = 0x1e;
  local_b8 = (int *)0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x24,"void test_1d_static() [X = 30UL]",local_a8,(unsigned_long *)&local_b8);
  local_bc = 0;
  do {
    local_b8 = piVar1;
    boost::detail::test_eq_impl<unsigned_long,int>
              ("(l.index(i))","i",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
               ,0x2b,"void test_1d_static() [X = 30UL]",(unsigned_long *)&local_b8,(int *)&local_bc)
    ;
    local_b8 = (int *)((long)local_a8 + (long)(int)local_bc * 4);
    local_b0 = local_b8;
    boost::detail::test_eq_impl<int*,int*>
              ("&(dptr[l.index(i)])","&(dptr[i])",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
               ,0x2d,"void test_1d_static() [X = 30UL]",&local_b8,&local_b0);
    t = (uint *)((long)local_a8 + (long)(int)local_bc * 4);
    *t = local_bc;
    boost::detail::test_eq_impl<int,int>
              ("(dptr[l.index(i)])","i",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
               ,0x31,"void test_1d_static() [X = 30UL]",(int *)t,(int *)&local_bc);
    local_bc = local_bc + 1;
    piVar1 = (int *)(ulong)local_bc;
  } while (local_bc < 0x1e);
  return;
}

Assistant:

void test_1d_static()
{ // {{{
    layout_mapping_left<
        dimensions<X>, dimensions<1>, dimensions<0>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.is_dynamic_stride(0)), false);

    BOOST_TEST_EQ((l.stride(0)), 1);

    BOOST_TEST_EQ((l.size()), X);
    BOOST_TEST_EQ((l.span()), X);

    int dptr[X];

    // Set all elements to a unique value.
    for (auto i = 0; i < l[0]; ++i)
    {
        BOOST_TEST_EQ((l.index(i)), i);

        BOOST_TEST_EQ(&(dptr[l.index(i)]), &(dptr[i])); 

        dptr[l.index(i)] = i;

        BOOST_TEST_EQ((dptr[l.index(i)]), i); 
    }
}